

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O0

bool __thiscall diy::Master::Proxy::fill_incoming(Proxy *this)

{
  bool bVar1;
  deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *this_00;
  reference this_01;
  int __type;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_diy::MemoryBuffer>_>,_bool> pVar2;
  accessor access;
  pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *x;
  iterator __end2;
  iterator __begin2;
  IncomingQueues *__range2;
  bool exists;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  _Rb_tree_iterator<std::pair<const_int,_diy::MemoryBuffer>_> in_stack_ffffffffffffff48;
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  *in_stack_ffffffffffffff78;
  critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
  local_78;
  IncomingQueues *local_18;
  byte local_9;
  
  local_9 = 0;
  std::
  map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::clear((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
           *)0x128c7d);
  local_18 = incoming((Master *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff3c);
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::begin(in_stack_ffffffffffffff78);
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::end(in_stack_ffffffffffffff78);
  while (bVar1 = concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                 ::
                 iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                 ::operator!=((iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                              (iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
        bVar1) {
    local_78.x_.
    super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>._M_impl.
    super__Deque_impl_data._M_start._M_first =
         (_Elt_pointer)
         concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
         ::
         iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
         ::operator*((iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                      *)0x128d3a);
    critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::access(&local_78,
             (char *)&((pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                        *)local_78.x_.
                          super__Deque_base<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first)->second,__type);
    resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::operator->((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                  *)&local_78);
    bVar1 = std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::empty
                      ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *
                       )0x128d66);
    if (!bVar1) {
      local_9 = 1;
      this_00 = (deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                (in_RDI + 0x18);
      resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::operator->((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                    *)&local_78);
      this_01 = std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
                front(this_00);
      QueueRecord::move(this_01);
      pVar2 = std::
              map<int,diy::MemoryBuffer,std::less<int>,std::allocator<std::pair<int_const,diy::MemoryBuffer>>>
              ::emplace<int_const&,diy::MemoryBuffer>
                        ((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                          *)this_00,(int *)in_stack_ffffffffffffff48._M_node,
                         (MemoryBuffer *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      in_stack_ffffffffffffff48 = pVar2.first._M_node;
      in_stack_ffffffffffffff47 = pVar2.second;
      resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::operator->((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                    *)&local_78);
      std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::pop_front
                ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      if (*(long *)(in_RDI + 0x10) != 0) {
        IExchangeInfo::dec_work((IExchangeInfo *)0x128e0c);
      }
    }
    resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::~resource_accessor
              ((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                *)0x128e36);
    concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
    ::
    iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
    ::operator++((iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  }
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::
  iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::~iterator_((iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                *)0x128cf5);
  concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
  ::
  iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::~iterator_((iterator_<std::_Rb_tree_iterator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
                *)0x128d02);
  return (bool)(local_9 & 1);
}

Assistant:

bool                fill_incoming() const
    {
        bool exists = false;

        incoming_.clear();

        // fill incoming_
        for (auto& x : master_->incoming(gid_))
        {
            auto access = x.second.access();
            if (!access->empty())
            {
                exists = true;
                incoming_.emplace(x.first, access->front().move());
                access->pop_front();
                if (iexchange_)
                    iexchange_->dec_work();
            }
        }

        return exists;
    }